

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.cpp
# Opt level: O0

void * luaL_checkudata(lua_State *L,int ud,char *tname)

{
  int iVar1;
  void *pvVar2;
  void *p;
  char *tname_local;
  int ud_local;
  lua_State *L_local;
  
  pvVar2 = lua_touserdata(L,ud);
  if ((pvVar2 != (void *)0x0) && (iVar1 = lua_getmetatable(L,ud), iVar1 != 0)) {
    lua_getfield(L,-10000,tname);
    iVar1 = lua_rawequal(L,-1,-2);
    if (iVar1 != 0) {
      lua_settop(L,-3);
      return pvVar2;
    }
  }
  luaL_typerror(L,ud,tname);
  return (void *)0x0;
}

Assistant:

LUALIB_API void *luaL_checkudata (lua_State *L, int ud, const char *tname) {
  void *p = lua_touserdata(L, ud);
  if (p != NULL) {  /* value is a userdata? */
    if (lua_getmetatable(L, ud)) {  /* does it have a metatable? */
      lua_getfield(L, LUA_REGISTRYINDEX, tname);  /* get correct metatable */
      if (lua_rawequal(L, -1, -2)) {  /* does it have the correct mt? */
        lua_pop(L, 2);  /* remove both metatables */
        return p;
      }
    }
  }
  luaL_typerror(L, ud, tname);  /* else error */
  return NULL;  /* to avoid warnings */
}